

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O3

int testCorrectEncode(double lat,double lon,int treatAsError)

{
  uint uVar1;
  char *pcVar2;
  Mapcodes mapcodes;
  Mapcodes local_29c;
  
  uVar1 = encodeLatLonToMapcodes(&local_29c,lat,lon,TERRITORY_UNKNOWN,0);
  if ((int)uVar1 < 1) {
    if (treatAsError == 0) {
      pcVar2 = "WARNING";
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      pcVar2 = "ERROR";
    }
    uVar1 = printf("*** %s *** encodeLatLonToMapcodes returns \'%d\' (should be > 0) for lat=%f, lon=%f\n"
                   ,lat,lon,pcVar2,(ulong)uVar1);
  }
  return uVar1;
}

Assistant:

static int testCorrectEncode(double lat, double lon, int treatAsError) {
    Mapcodes mapcodes;
    int nrResults = encodeLatLonToMapcodes(&mapcodes, lat, lon, TERRITORY_UNKNOWN, 0);
    if (nrResults <= 0) {
        if (treatAsError) {
            foundError();
        }
        printf("*** %s *** encodeLatLonToMapcodes returns '%d' (should be > 0) for lat=%f, lon=%f\n",
               treatAsError ? "ERROR" : "WARNING", nrResults, lat, lon);
    }
    return 1;
}